

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

bool Js::JavascriptLibrary::InitializeBigIntConstructor
               (DynamicObject *bigIntConstructor,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  ScriptContext *this;
  JavascriptLibrary *this_00;
  Var value;
  DynamicObject **ppDVar1;
  PropertyString *value_00;
  JavascriptLibrary *library;
  ScriptContext *scriptContext;
  int numberOfProperties;
  DeferredInitializeMode mode_local;
  DeferredTypeHandlerBase *typeHandler_local;
  DynamicObject *bigIntConstructor_local;
  
  DeferredTypeHandlerBase::Convert(typeHandler,bigIntConstructor,mode,3,0);
  this = RecyclableObject::GetScriptContext(&bigIntConstructor->super_RecyclableObject);
  this_00 = RecyclableObject::GetLibrary(&bigIntConstructor->super_RecyclableObject);
  value = TaggedInt::ToVarUnchecked(1);
  AddMember(this_00,bigIntConstructor,0xd1,value,'\x02');
  ppDVar1 = Memory::WriteBarrierPtr::operator_cast_to_DynamicObject__
                      ((WriteBarrierPtr *)&(this_00->super_JavascriptLibraryBase).bigintPrototype);
  AddMember(this_00,bigIntConstructor,0x124,*ppDVar1,'\0');
  value_00 = ScriptContext::GetPropertyString(this,0x10d);
  AddMember(this_00,bigIntConstructor,0x106,value_00,'\x02');
  DynamicObject::SetHasNoEnumerableProperties(bigIntConstructor,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeBigIntConstructor(DynamicObject* bigIntConstructor, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        const int numberOfProperties = 3;
        typeHandler->Convert(bigIntConstructor, mode, numberOfProperties);

        // TODO(BigInt): Any new function addition/deletion/modification should also be updated in JavascriptLibrary::ProfilerRegisterBigInt
        // so that the update is in sync with profiler
        ScriptContext* scriptContext = bigIntConstructor->GetScriptContext();
        JavascriptLibrary* library = bigIntConstructor->GetLibrary();
        library->AddMember(bigIntConstructor, PropertyIds::length, TaggedInt::ToVarUnchecked(1), PropertyConfigurable);
        library->AddMember(bigIntConstructor, PropertyIds::prototype, library->bigintPrototype, PropertyNone);
        library->AddMember(bigIntConstructor, PropertyIds::name, scriptContext->GetPropertyString(PropertyIds::BigInt), PropertyConfigurable);

        bigIntConstructor->SetHasNoEnumerableProperties(true);

        return true;
    }